

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionUtils.cpp
# Opt level: O1

Expression * __thiscall
ExpressionUtils::queueToExp
          (ExpressionUtils *this,
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *queueValOp)

{
  pointer *pppEVar1;
  Num **__args;
  _Elt_pointer pbVar2;
  pointer pcVar3;
  double dVar4;
  size_type *psVar5;
  int iVar6;
  ulong uVar7;
  Num *pNVar8;
  int *piVar9;
  Expression *pEVar10;
  Mult *this_00;
  Var *pVVar11;
  Neg *this_01;
  undefined8 uVar12;
  Expression *pEVar13;
  Expression *pEVar14;
  iterator iVar15;
  string local_108;
  string local_e8;
  size_type *local_c8;
  string front;
  stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_> expStack;
  Num *local_50;
  Expression *num;
  Expression *neg;
  Expression *var;
  Expression *exp;
  
  expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  front.field_2._8_8_ = 0;
  std::_Deque_base<Expression_*,_std::allocator<Expression_*>_>::_M_initialize_map
            ((_Deque_base<Expression_*,_std::allocator<Expression_*>_> *)((long)&front.field_2 + 8),
             0);
  do {
    pbVar2 = (queueValOp->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((queueValOp->c).
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == pbVar2) {
      if ((_Elt_pointer)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node ==
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) {
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_node =
             (_Map_pointer)
             (expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last[-1] + 0x40);
      }
      pEVar13 = (Expression *)
                ((Expression *)
                expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_node)[-1]._vptr_Expression;
      std::_Deque_base<Expression_*,_std::allocator<Expression_*>_>::~_Deque_base
                ((_Deque_base<Expression_*,_std::allocator<Expression_*>_> *)
                 ((long)&front.field_2 + 8));
      return pEVar13;
    }
    local_c8 = &front._M_string_length;
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar3,pcVar3 + pbVar2->_M_string_length);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&queueValOp->c);
    iVar6 = std::__cxx11::string::compare((char *)&local_c8);
    if ((((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)&local_c8), iVar6 == 0)) ||
        (iVar6 = std::__cxx11::string::compare((char *)&local_c8), iVar6 == 0)) ||
       (iVar6 = std::__cxx11::string::compare((char *)&local_c8), psVar5 = local_c8, iVar6 == 0)) {
      pEVar13 = (Expression *)
                expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      if ((_Elt_pointer)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node ==
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) {
        pEVar13 = expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last[-1] + 0x40;
      }
      pEVar13 = (Expression *)pEVar13[-1]._vptr_Expression;
      if ((_Elt_pointer)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node ==
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) {
        operator_delete(expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_cur,0x200);
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur =
             (_Elt_pointer)
             expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_last[-1];
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first =
             (_Elt_pointer)
             ((Expression *)
              expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur + 0x40);
        pEVar10 = (Expression *)
                  expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur + 0x3f;
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last =
             expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_last + -1;
      }
      else {
        pEVar10 = (Expression *)
                  (expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
                   .super__Deque_impl_data._M_start._M_node + -1);
      }
      pEVar14 = pEVar10;
      if (pEVar10 ==
          (Expression *)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) {
        pEVar14 = expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last[-1] + 0x40;
      }
      pEVar14 = (Expression *)pEVar14[-1]._vptr_Expression;
      if (pEVar10 ==
          (Expression *)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) {
        operator_delete(expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_cur,0x200);
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur =
             (_Elt_pointer)
             expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_last[-1];
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first =
             (_Elt_pointer)
             ((Expression *)
              expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur + 0x40);
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_node =
             (_Map_pointer)
             ((Expression *)
              expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur + 0x3f);
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last =
             expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_last + -1;
      }
      else {
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_node = (_Map_pointer)(pEVar10 + -1);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_c8);
      if (iVar6 == 0) {
        this_00 = (Mult *)operator_new(0x18);
        Plus::Plus((Plus *)this_00,pEVar14,pEVar13);
LAB_00109976:
        iVar15._M_current =
             (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        var = &this_00->super_Expression;
        if (iVar15._M_current ==
            (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<Expression*,std::allocator<Expression*>>::_M_realloc_insert<Expression*const&>
                    ((vector<Expression*,std::allocator<Expression*>> *)this,iVar15,&var);
        }
        else {
          *iVar15._M_current = &this_00->super_Expression;
          pppEVar1 = &(this->deathMap).
                      super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_c8);
        if (iVar6 == 0) {
          this_00 = (Mult *)operator_new(0x18);
          Minus::Minus((Minus *)this_00,pEVar14,pEVar13);
          goto LAB_00109976;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_c8);
        if (iVar6 == 0) {
          this_00 = (Mult *)operator_new(0x18);
          Div::Div((Div *)this_00,pEVar14,pEVar13);
          goto LAB_00109976;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_c8);
        if (iVar6 == 0) {
          this_00 = (Mult *)operator_new(0x18);
          Mult::Mult(this_00,pEVar14,pEVar13);
          goto LAB_00109976;
        }
      }
      pNVar8 = (Num *)var;
      if ((Expression *)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node !=
          (Expression *)
          (expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first + -1)) goto LAB_001099af;
      std::deque<Expression*,std::allocator<Expression*>>::_M_push_back_aux<Expression*const&>
                ((deque<Expression*,std::allocator<Expression*>> *)(front.field_2._M_local_buf + 8),
                 &var);
    }
    else {
      if ((char)*local_c8 == 0x2d) {
        uVar7 = std::__cxx11::string::find((char)(string *)&local_c8,0x2d);
        std::__cxx11::string::erase((ulong)&local_c8,uVar7);
        psVar5 = local_c8;
        if ((int)(char)*local_c8 - 0x30U < 10) {
          pNVar8 = (Num *)operator_new(0x10);
          piVar9 = __errno_location();
          iVar6 = *piVar9;
          *piVar9 = 0;
          dVar4 = strtod((char *)psVar5,(char **)&var);
          if (var == (Expression *)psVar5) goto LAB_00109d09;
          if (*piVar9 == 0) {
            *piVar9 = iVar6;
          }
          else if (*piVar9 == 0x22) goto LAB_00109d21;
          Num::Num(pNVar8,dVar4);
          iVar15._M_current =
               (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_50 = pNVar8;
          if (iVar15._M_current ==
              (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Expression*,std::allocator<Expression*>>::
            _M_realloc_insert<Expression*const&>
                      ((vector<Expression*,std::allocator<Expression*>> *)this,iVar15,
                       (Expression **)&local_50);
          }
          else {
            *iVar15._M_current = (Expression *)pNVar8;
            pppEVar1 = &(this->deathMap).
                        super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppEVar1 = *pppEVar1 + 1;
          }
          this_01 = (Neg *)operator_new(0x10);
          Neg::Neg(this_01,&local_50->super_Expression);
          iVar15._M_current =
               (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar15._M_current !=
              (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00109c7c;
          num = (Expression *)this_01;
          std::vector<Expression*,std::allocator<Expression*>>::_M_realloc_insert<Expression*const&>
                    ((vector<Expression*,std::allocator<Expression*>> *)this,iVar15,&num);
        }
        else {
          pVVar11 = (Var *)operator_new(0x28);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,psVar5,front._M_dataplus._M_p + (long)psVar5);
          Var::Var(pVVar11,&local_108);
          neg = (Expression *)pVVar11;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          iVar15._M_current =
               (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar15._M_current ==
              (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Expression*,std::allocator<Expression*>>::
            _M_realloc_insert<Expression*const&>
                      ((vector<Expression*,std::allocator<Expression*>> *)this,iVar15,&neg);
          }
          else {
            *iVar15._M_current = neg;
            pppEVar1 = &(this->deathMap).
                        super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppEVar1 = *pppEVar1 + 1;
          }
          this_01 = (Neg *)operator_new(0x10);
          Neg::Neg(this_01,neg);
          iVar15._M_current =
               (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar15._M_current ==
              (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            num = (Expression *)this_01;
            std::vector<Expression*,std::allocator<Expression*>>::
            _M_realloc_insert<Expression*const&>
                      ((vector<Expression*,std::allocator<Expression*>> *)this,iVar15,&num);
          }
          else {
LAB_00109c7c:
            *iVar15._M_current = &this_01->super_Expression;
            pppEVar1 = &(this->deathMap).
                        super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppEVar1 = *pppEVar1 + 1;
            num = &this_01->super_Expression;
          }
        }
        __args = (Num **)&num;
        pNVar8 = (Num *)num;
      }
      else if ((int)(char)*local_c8 - 0x30U < 10) {
        pNVar8 = (Num *)operator_new(0x10);
        piVar9 = __errno_location();
        iVar6 = *piVar9;
        *piVar9 = 0;
        dVar4 = strtod((char *)psVar5,(char **)&var);
        if (var == (Expression *)psVar5) {
          std::__throw_invalid_argument("stod");
LAB_00109d09:
          std::__throw_invalid_argument("stod");
LAB_00109d15:
          std::__throw_out_of_range("stod");
LAB_00109d21:
          uVar12 = std::__throw_out_of_range("stod");
          operator_delete(piVar9,0x10);
          if (local_c8 != &front._M_string_length) {
            operator_delete(local_c8,front._M_string_length + 1);
          }
          std::_Deque_base<Expression_*,_std::allocator<Expression_*>_>::~_Deque_base
                    ((_Deque_base<Expression_*,_std::allocator<Expression_*>_> *)
                     ((long)&front.field_2 + 8));
          _Unwind_Resume(uVar12);
        }
        if (*piVar9 == 0) {
          *piVar9 = iVar6;
        }
        else if (*piVar9 == 0x22) goto LAB_00109d15;
        Num::Num(pNVar8,dVar4);
        iVar15._M_current =
             (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_50 = pNVar8;
        if (iVar15._M_current ==
            (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<Expression*,std::allocator<Expression*>>::_M_realloc_insert<Expression*const&>
                    ((vector<Expression*,std::allocator<Expression*>> *)this,iVar15,
                     (Expression **)&local_50);
        }
        else {
          *iVar15._M_current = (Expression *)pNVar8;
          pppEVar1 = &(this->deathMap).
                      super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
        __args = &local_50;
        pNVar8 = local_50;
      }
      else {
        pVVar11 = (Var *)operator_new(0x28);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,psVar5,front._M_dataplus._M_p + (long)psVar5);
        Var::Var(pVVar11,&local_e8);
        neg = (Expression *)pVVar11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        iVar15._M_current =
             (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar15._M_current ==
            (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<Expression*,std::allocator<Expression*>>::_M_realloc_insert<Expression*const&>
                    ((vector<Expression*,std::allocator<Expression*>> *)this,iVar15,&neg);
        }
        else {
          *iVar15._M_current = neg;
          pppEVar1 = &(this->deathMap).
                      super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
        __args = (Num **)&neg;
        pNVar8 = (Num *)neg;
      }
      if ((_Elt_pointer)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node ==
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first + -1) {
        std::deque<Expression*,std::allocator<Expression*>>::_M_push_back_aux<Expression*const&>
                  ((deque<Expression*,std::allocator<Expression*>> *)
                   (front.field_2._M_local_buf + 8),(Expression **)__args);
      }
      else {
LAB_001099af:
        *expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_node = (Expression **)pNVar8;
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_node =
             expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node + 1;
      }
    }
    if (local_c8 != &front._M_string_length) {
      operator_delete(local_c8,front._M_string_length + 1);
    }
  } while( true );
}

Assistant:

Expression *ExpressionUtils::queueToExp(queue<string> &queueValOp) {
    //all tokens in queue - convert to Expressions
    stack<Expression *> expStack;
    while (!queueValOp.empty()) {
        Expression *num;
        Expression *neg;
        Expression *var;
        //take number from front
        string front = queueValOp.front();
        queueValOp.pop();
        if (front == "+" || front == "-" || front == "*" || front == "/") {//operator
            Expression *secondNum = expStack.top();
            expStack.pop();
            Expression *firstNum = expStack.top();
            expStack.pop();

            Expression *exp;
            if (front == "+") {
                exp = new Plus(firstNum, secondNum);
                deathMap.push_back(exp);
            } else if (front == "-") {
                exp = new Minus(firstNum, secondNum);
                deathMap.push_back(exp);
            } else if (front == "/") {
                exp = new Div(firstNum, secondNum);
                deathMap.push_back(exp);
            } else if (front == "*") {
                exp = new Mult(firstNum, secondNum);
                deathMap.push_back(exp);
            }
            expStack.push(exp);
        } else if (front[0] == '-') {//neg num
            front.erase(front.find('-'), 1);
            if (isdigit(front[0])) {//num
                num = new Num(stod(front));
                deathMap.push_back(num);
                neg = new Neg(num);
                deathMap.push_back(neg);
                expStack.push(neg);
            } else { //var
                var = new Var(front);
                deathMap.push_back(var);
                neg = new Neg(var);
                deathMap.push_back(neg);
                expStack.push(neg);
            }
        } else if (isdigit(front[0])) {//num
            num = new Num(stod(front));
            deathMap.push_back(num);
            expStack.push(num);
        } else { //var
            var = new Var(front);
            deathMap.push_back(var);
            expStack.push(var);
        }
    }
    //only one (complex) expression left on stack
    return expStack.top();
}